

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.h
# Opt level: O3

void __thiscall
spvtools::val::ValidationState_t::
RegisterDecorationsForStructMember<std::_Rb_tree_const_iterator<spvtools::val::Decoration>>
          (ValidationState_t *this,uint32_t struct_id,uint32_t member_index,
          _Rb_tree_const_iterator<spvtools::val::Decoration> begin,
          _Rb_tree_const_iterator<spvtools::val::Decoration> end)

{
  _Rb_tree<spvtools::val::Decoration,spvtools::val::Decoration,std::_Identity<spvtools::val::Decoration>,std::less<spvtools::val::Decoration>,std::allocator<spvtools::val::Decoration>>
  *this_00;
  _Rb_tree_const_iterator<spvtools::val::Decoration> iter;
  uint32_t local_5c;
  Decoration local_58;
  
  local_5c = struct_id;
  this_00 = (_Rb_tree<spvtools::val::Decoration,spvtools::val::Decoration,std::_Identity<spvtools::val::Decoration>,std::less<spvtools::val::Decoration>,std::allocator<spvtools::val::Decoration>>
             *)std::
               map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
               ::operator[](&this->id_decorations_,&local_5c);
  if (begin._M_node != end._M_node) {
    do {
      local_58.dec_type_ = begin._M_node[1]._M_color;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_58.params_,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&begin._M_node[1]._M_parent)
      ;
      local_58.struct_member_index_ = member_index;
      std::
      _Rb_tree<spvtools::val::Decoration,spvtools::val::Decoration,std::_Identity<spvtools::val::Decoration>,std::less<spvtools::val::Decoration>,std::allocator<spvtools::val::Decoration>>
      ::_M_insert_unique<spvtools::val::Decoration_const&>(this_00,&local_58);
      if (local_58.params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.params_.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.params_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.params_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      begin._M_node = (_Base_ptr)std::_Rb_tree_increment(begin._M_node);
    } while (begin._M_node != end._M_node);
  }
  return;
}

Assistant:

void RegisterDecorationsForStructMember(uint32_t struct_id,
                                          uint32_t member_index, InputIt begin,
                                          InputIt end) {
    std::set<Decoration>& cur_decs = id_decorations_[struct_id];
    for (InputIt iter = begin; iter != end; ++iter) {
      Decoration dec = *iter;
      dec.set_struct_member_index(member_index);
      cur_decs.insert(dec);
    }
  }